

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O3

Vec_Int_t * Io_ReadFins(Abc_Ntk_t *pNtk,char *pFileName,int fVerbose)

{
  int iVar1;
  int iVar2;
  Mio_Library_t *pMVar3;
  Abc_Obj_t *pObj;
  int iVar4;
  int iVar5;
  FILE *__stream;
  Abc_Nam_t *p;
  Vec_Int_t *p_00;
  int *piVar6;
  char *pcVar7;
  Vec_Ptr_t *pVVar8;
  Vec_Int_t *p_01;
  char *pcVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  int fFound;
  char Buffer [1000];
  int local_434;
  Abc_Nam_t *local_430;
  Mio_Library_t *local_428;
  char *local_420;
  char local_418 [1000];
  
  pMVar3 = (Mio_Library_t *)pNtk->pManFunc;
  __stream = fopen(pFileName,"r");
  if (__stream == (FILE *)0x0) {
    p_01 = (Vec_Int_t *)0x0;
    printf("Cannot open input file \"%s\" for reading.\n",pFileName);
  }
  else {
    local_428 = pMVar3;
    local_420 = pFileName;
    p = Abc_NamStart(1000,10);
    p_00 = (Vec_Int_t *)malloc(0x10);
    p_00->nCap = 1000;
    p_00->nSize = 0;
    piVar6 = (int *)malloc(4000);
    p_00->pArray = piVar6;
    Vec_IntPush(p_00,-1);
    pVVar8 = pNtk->vObjs;
    if (0 < pVVar8->nSize) {
      lVar12 = 0;
      do {
        pObj = (Abc_Obj_t *)pVVar8->pArray[lVar12];
        if (((pObj != (Abc_Obj_t *)0x0) && (uVar10 = *(uint *)&pObj->field_0x14 & 0xf, uVar10 < 8))
           && ((0xa4U >> uVar10 & 1) != 0)) {
          pcVar7 = Abc_ObjName(pObj);
          Abc_NamStrFindOrAdd(p,pcVar7,&local_434);
          if (local_434 != 0) {
            pcVar7 = Abc_ObjName(pObj);
            p_01 = (Vec_Int_t *)0x0;
            printf("The same name \"%s\" appears twice among CIs and internal nodes.\n",pcVar7);
            goto LAB_002b1ffe;
          }
          Vec_IntPush(p_00,pObj->Id);
          pVVar8 = pNtk->vObjs;
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 < pVVar8->nSize);
    }
    iVar1 = p_00->nSize;
    iVar4 = Abc_NamObjNumMax(p);
    if (iVar1 != iVar4) {
      __assert_fail("Vec_IntSize(vMap) == Abc_NamObjNumMax(pNam)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDetect.c"
                    ,0xc3,"Vec_Int_t *Io_ReadFins(Abc_Ntk_t *, char *, int)");
    }
    p_01 = (Vec_Int_t *)malloc(0x10);
    p_01->nCap = 1000;
    p_01->nSize = 0;
    piVar6 = (int *)malloc(4000);
    p_01->pArray = piVar6;
    Vec_IntPush(p_01,-1);
    Vec_IntPush(p_01,-1);
    pcVar7 = fgets(local_418,1000,__stream);
    iVar4 = 1;
    local_430 = p;
    if (pcVar7 != (char *)0x0) {
      while (p = local_430, pcVar7 = strtok(local_418," \n\r\t"), pcVar7 != (char *)0x0) {
        iVar5 = atoi(pcVar7);
        if (iVar4 != iVar5) {
          puts("Line numbers are not consecutive. Quitting.");
          if (p_01->pArray != (int *)0x0) {
            free(p_01->pArray);
          }
          free(p_01);
          p_01 = (Vec_Int_t *)0x0;
          goto LAB_002b1ffe;
        }
        pcVar7 = strtok((char *)0x0," \n\r\t");
        uVar10 = Abc_NamStrFind(p,pcVar7);
        if (uVar10 == 0) {
          printf("Cannot find object with name \"%s\".\n",pcVar7);
        }
        else {
          pcVar7 = strtok((char *)0x0," \n\r\t");
          if (((pNtk->ntkFunc == ABC_FUNC_MAP) && (pNtk->ntkType == ABC_NTK_LOGIC)) &&
             ((iVar5 = strcmp(pcVar7,"SA0"), iVar5 != 0 &&
              ((iVar5 = strcmp(pcVar7,"SA1"), iVar5 != 0 &&
               (iVar5 = strcmp(pcVar7,"NEG"), iVar5 != 0)))))) {
            iVar5 = Io_ReadFinTypeMapped(local_428,pcVar7);
          }
          else {
            iVar5 = Io_ReadFinType(pcVar7);
          }
          if (iVar5 == -100) {
            if (((int)uVar10 < 0) || (pNtk->vObjs->nSize <= (int)uVar10)) goto LAB_002b2042;
            pcVar9 = Abc_ObjName((Abc_Obj_t *)pNtk->vObjs->pArray[uVar10]);
            printf("Cannot read type \"%s\" of object \"%s\".\n",pcVar7,pcVar9);
          }
          else {
            if (((int)uVar10 < 0) || (iVar1 <= (int)uVar10)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            Vec_IntPush(p_01,p_00->pArray[uVar10]);
            Vec_IntPush(p_01,iVar5);
          }
        }
        pcVar7 = fgets(local_418,1000,__stream);
        iVar4 = iVar4 + 1;
        p = local_430;
        if (pcVar7 == (char *)0x0) break;
      }
    }
    iVar1 = p_01->nSize;
    if (iVar1 != iVar4 * 2) {
      __assert_fail("Vec_IntSize(vPairs) == 2 * nLines",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDetect.c"
                    ,0xed,"Vec_Int_t *Io_ReadFins(Abc_Ntk_t *, char *, int)");
    }
    printf("Finished reading %d lines from the fault list file \"%s\".\n",(ulong)(iVar4 - 1),
           local_420);
    if (3 < iVar1 && fVerbose != 0) {
      piVar6 = p_01->pArray;
      uVar11 = 2;
      iVar4 = 3;
      do {
        iVar5 = piVar6[uVar11];
        if (((long)iVar5 < 0) || (pNtk->vObjs->nSize <= iVar5)) {
LAB_002b2042:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        iVar2 = piVar6[uVar11 + 1];
        pcVar9 = Abc_ObjName((Abc_Obj_t *)pNtk->vObjs->pArray[iVar5]);
        uVar10 = iVar2 + 99;
        pcVar7 = "Unknown";
        if (uVar10 < 0xb) {
          pcVar7 = *(char **)(&DAT_00bd3ef0 + (ulong)uVar10 * 8);
        }
        printf("%-10d%-10s%-10s\n",uVar11 >> 1 & 0x7fffffff,pcVar9,pcVar7);
        uVar11 = uVar11 + 2;
        iVar4 = iVar4 + 2;
        p = local_430;
      } while (iVar4 < iVar1);
    }
LAB_002b1ffe:
    if (p_00->pArray != (int *)0x0) {
      free(p_00->pArray);
    }
    free(p_00);
    Abc_NamDeref(p);
    fclose(__stream);
  }
  return p_01;
}

Assistant:

Vec_Int_t * Io_ReadFins( Abc_Ntk_t * pNtk, char * pFileName, int fVerbose )
{
    Mio_Library_t * pLib = (Mio_Library_t *)pNtk->pManFunc;
    char Buffer[1000];
    Abc_Obj_t * pObj;
    Abc_Nam_t * pNam;
    Vec_Int_t * vMap; 
    Vec_Int_t * vPairs = NULL;
    int i, Type, iObj, fFound, nLines = 1;
    FILE * pFile = fopen( pFileName, "r" );
    if ( pFile == NULL )
    {
        printf( "Cannot open input file \"%s\" for reading.\n", pFileName );
        return NULL;
    }
    // map CI/node names into their IDs
    pNam = Abc_NamStart( 1000, 10 );
    vMap = Vec_IntAlloc( 1000 );
    Vec_IntPush( vMap, -1 );
    Abc_NtkForEachObj( pNtk, pObj, i )
    {
        if ( !Abc_ObjIsCi(pObj) && !Abc_ObjIsNode(pObj) )
            continue;
        Abc_NamStrFindOrAdd( pNam, Abc_ObjName(pObj), &fFound );
        if ( fFound )
        {
            printf( "The same name \"%s\" appears twice among CIs and internal nodes.\n", Abc_ObjName(pObj) );
            goto finish;
        }
        Vec_IntPush( vMap, Abc_ObjId(pObj) );
    }
    assert( Vec_IntSize(vMap) == Abc_NamObjNumMax(pNam) );
    // read file lines
    vPairs = Vec_IntAlloc( 1000 );
    Vec_IntPushTwo( vPairs, -1, -1 );
    while ( fgets(Buffer, 1000, pFile) != NULL )
    {
        // read line number
        char * pToken = strtok( Buffer, " \n\r\t" );
        if ( pToken == NULL )
            break;
        if ( nLines++ != atoi(pToken) )
        {
            printf( "Line numbers are not consecutive. Quitting.\n" );
            Vec_IntFreeP( &vPairs );
            goto finish;
        }
        // read object name and find its ID
        pToken = strtok( NULL, " \n\r\t" );
        iObj = Abc_NamStrFind( pNam, pToken );
        if ( !iObj )
        {
            printf( "Cannot find object with name \"%s\".\n", pToken );
            continue;
        }
        // read type
        pToken = strtok( NULL, " \n\r\t" );
        if ( Abc_NtkIsMappedLogic(pNtk) )
        {
            if ( !strcmp(pToken, "SA0") || !strcmp(pToken, "SA1") || !strcmp(pToken, "NEG") )
                Type = Io_ReadFinType( pToken );
            else
                Type = Io_ReadFinTypeMapped( pLib, pToken );
        }
        else
            Type = Io_ReadFinType( pToken );
        if ( Type == ABC_FIN_NONE )
        {
            printf( "Cannot read type \"%s\" of object \"%s\".\n", pToken, Abc_ObjName(Abc_NtkObj(pNtk, iObj)) );
            continue;
        }
        Vec_IntPushTwo( vPairs, Vec_IntEntry(vMap, iObj), Type );
    }
    assert( Vec_IntSize(vPairs) == 2 * nLines );
    printf( "Finished reading %d lines from the fault list file \"%s\".\n", nLines - 1, pFileName );

    // verify the reader by printing the results
    if ( fVerbose )
        Vec_IntForEachEntryDoubleStart( vPairs, iObj, Type, i, 2 )
            printf( "%-10d%-10s%-10s\n", i/2, Abc_ObjName(Abc_NtkObj(pNtk, iObj)), Io_WriteFinType(Type) );

finish:
    Vec_IntFree( vMap );
    Abc_NamDeref( pNam );
    fclose( pFile );
    return vPairs;
}